

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O1

int Bbl_ManSopCheckUnique(Bbl_Man_t *p,char *pSop,int nVars,int nCubes,int iFunc)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  int *piVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int *piVar11;
  int iVar12;
  int iVar13;
  
  sVar6 = strlen(pSop);
  uVar8 = (int)sVar6 + 1;
  uVar4 = (int)sVar6 + 4;
  if (-1 < (int)uVar8) {
    uVar4 = uVar8;
  }
  iVar12 = 0x10;
  if (nVars < 0x10) {
    iVar12 = nVars;
  }
  iVar9 = 0x10;
  if (nCubes < 0x10) {
    iVar9 = nCubes;
  }
  iVar10 = p->SopMap[iVar12][iVar9];
  if (iVar10 != 0) {
    iVar13 = (uint)(0 < (int)(uVar8 & 0x80000003)) + ((int)uVar4 >> 2);
    pcVar2 = p->pEnts->pArray;
    pcVar3 = p->pFncs->pArray;
    do {
      iVar1 = *(int *)(pcVar2 + iVar10);
      piVar7 = (int *)(pcVar3 + iVar1);
      if ((nCubes < 0x10 && nVars < 0x10) && (*piVar7 != iVar13)) {
        __assert_fail("nVars == 16 || nCubes == 16 || pFnc->nWords == nWords",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/bbl/bblif.c"
                      ,0x3a7,"int Bbl_ManSopCheckUnique(Bbl_Man_t *, char *, int, int, int)");
      }
      if ((*piVar7 == iVar13) && (iVar5 = bcmp(piVar7 + 1,pSop,(long)(int)uVar8), iVar5 == 0)) {
        return iVar1;
      }
      iVar10 = *(int *)(pcVar2 + (long)iVar10 + 4);
    } while (iVar10 != 0);
  }
  piVar11 = p->SopMap[iVar12] + iVar9;
  iVar12 = *piVar11;
  piVar7 = (int *)Vec_StrFetch(p->pEnts,8);
  *piVar7 = iFunc;
  piVar7[1] = iVar12;
  *piVar11 = (int)piVar7 - *(int *)&p->pEnts->pArray;
  return iFunc;
}

Assistant:

int Bbl_ManSopCheckUnique( Bbl_Man_t * p, char * pSop, int nVars, int nCubes, int iFunc )
{
    Bbl_Fnc_t * pFnc;
    Bbl_Ent_t * pEnt;
    int h, Length = strlen(pSop) + 1;
    int nWords = (Length / 4 + (Length % 4 > 0));
    if ( nVars > 16 )   nVars = 16;
    if ( nCubes > 16 )  nCubes = 16;
//    if ( nVars == 16 && nCubes == 16 )
//        return iFunc;
    for ( h = p->SopMap[nVars][nCubes]; h; h = pEnt->iNext )
    {
        pEnt = Bbl_VecEnt( p->pEnts, h );
        pFnc = Bbl_VecFnc( p->pFncs, pEnt->iFunc );
        assert( nVars == 16 || nCubes == 16 || pFnc->nWords == nWords );
        if ( pFnc->nWords == nWords && memcmp( pFnc->pWords, pSop, Length ) == 0 )
            return pEnt->iFunc;
    }
    p->SopMap[nVars][nCubes] = Bbl_ManCreateEntry( p, iFunc, p->SopMap[nVars][nCubes] );
    return iFunc;
}